

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3EvalPhraseMergeToken(Fts3Table *pTab,Fts3Phrase *p,int iToken,char *pList,int nList)

{
  byte *pbVar1;
  u8 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pEnd;
  byte *pBuf;
  byte *pbVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  byte *pbVar10;
  undefined1 *puVar11;
  int iVar12;
  int iVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  undefined1 *puVar16;
  int iVar17;
  long in_FS_OFFSET;
  char *p_1;
  char *p2;
  char *p1;
  u64 iVal;
  int local_84;
  byte *local_58;
  byte *local_50;
  byte *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pList == (char *)0x0) {
    sqlite3_free((p->doclist).aAll);
    (p->doclist).aAll = (char *)0x0;
    (p->doclist).nAll = 0;
  }
  else {
    iVar5 = p->iDoclistToken;
    if (iVar5 < 0) {
      (p->doclist).aAll = pList;
      (p->doclist).nAll = nList;
    }
    else {
      pbVar6 = (byte *)(p->doclist).aAll;
      if (pbVar6 != (byte *)0x0) {
        iVar13 = (p->doclist).nAll;
        local_84 = iVar5 - iToken;
        pBuf = pbVar6;
        iVar17 = nList;
        if (iVar5 < iToken) {
          local_84 = iToken - iVar5;
          pBuf = (byte *)pList;
          pList = (char *)pbVar6;
          iVar17 = iVar13;
          iVar13 = nList;
        }
        uVar2 = pTab->bDescIdx;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        pbVar6 = pBuf;
        local_50 = pBuf;
        local_48 = (byte *)pList;
        if (uVar2 == '\0') {
LAB_001cce7a:
          local_58 = pbVar6;
          if (iVar17 < 1) {
            local_48 = (byte *)0x0;
            puVar15 = (undefined1 *)0x0;
          }
          else {
            local_40 = &DAT_aaaaaaaaaaaaaaaa;
            iVar5 = sqlite3Fts3GetVarintU(pList,(sqlite_uint64 *)&local_40);
            local_48 = (byte *)pList + iVar5;
            puVar15 = local_40;
          }
          if (iVar13 < 1) {
            local_50 = (byte *)0x0;
            puVar14 = (undefined1 *)0x0;
          }
          else {
            local_40 = &DAT_aaaaaaaaaaaaaaaa;
            iVar5 = sqlite3Fts3GetVarintU((char *)pBuf,(sqlite_uint64 *)&local_40);
            local_50 = pBuf + iVar5;
            puVar14 = local_40;
          }
          if (local_50 != (byte *)0x0 && local_48 != (byte *)0x0) {
            bVar4 = false;
            puVar16 = (undefined1 *)0x0;
            do {
              pbVar1 = local_58;
              iVar5 = -(uint)(puVar15 != puVar14);
              if ((long)puVar14 < (long)puVar15) {
                iVar5 = 1;
              }
              iVar12 = -iVar5;
              if (uVar2 == '\0') {
                iVar12 = iVar5;
              }
              if (iVar12 == 0) {
                uVar7 = (long)puVar16 - (long)puVar15;
                if (!bVar4) {
                  uVar7 = (long)puVar15 - (long)puVar16;
                }
                if (uVar2 == '\0') {
                  uVar7 = (long)puVar15 - (long)puVar16;
                }
                do {
                  pbVar10 = local_58;
                  bVar8 = (byte)uVar7;
                  *pbVar10 = bVar8 | 0x80;
                  local_58 = pbVar10 + 1;
                  bVar3 = 0x7f < uVar7;
                  uVar7 = uVar7 >> 7;
                } while (bVar3);
                *pbVar10 = bVar8;
                iVar5 = fts3PoslistPhraseMerge
                                  ((char **)&local_58,local_84,0,1,(char **)&local_48,
                                   (char **)&local_50);
                pbVar10 = local_48;
                puVar11 = puVar15;
                bVar3 = true;
                if (iVar5 == 0) {
                  puVar11 = puVar16;
                  local_58 = pbVar1;
                  bVar3 = bVar4;
                }
                puVar16 = puVar11;
                if (local_48 < (byte *)pList + iVar17) {
                  local_40 = &DAT_aaaaaaaaaaaaaaaa;
                  iVar5 = sqlite3Fts3GetVarintU((char *)local_48,(sqlite_uint64 *)&local_40);
                  local_48 = pbVar10 + iVar5;
                  puVar11 = (undefined1 *)-(long)local_40;
                  if (uVar2 == '\0') {
                    puVar11 = local_40;
                  }
                  puVar15 = puVar15 + (long)puVar11;
                }
                else {
                  local_48 = (byte *)0x0;
                }
                pbVar1 = local_50;
                bVar4 = bVar3;
                if (local_50 < pBuf + iVar13) {
                  local_40 = &DAT_aaaaaaaaaaaaaaaa;
                  iVar5 = sqlite3Fts3GetVarintU((char *)local_50,(sqlite_uint64 *)&local_40);
                  local_50 = pbVar1 + iVar5;
                  puVar11 = (undefined1 *)-(long)local_40;
                  if (uVar2 == '\0') {
                    puVar11 = local_40;
                  }
                  puVar14 = puVar14 + (long)puVar11;
                }
                else {
                  local_50 = (byte *)0x0;
                }
              }
              else if (iVar12 < 0) {
                bVar8 = *local_48;
                if (*local_48 != 0) {
                  do {
                    pbVar1 = local_48 + 1;
                    local_48 = local_48 + 1;
                    bVar9 = bVar8 & 0x80;
                    bVar8 = *pbVar1;
                  } while (bVar9 != 0 || *pbVar1 != 0);
                }
                local_48 = local_48 + 1;
                if (local_48 < (byte *)pList + iVar17) {
                  local_40 = &DAT_aaaaaaaaaaaaaaaa;
                  iVar5 = sqlite3Fts3GetVarintU((char *)local_48,(sqlite_uint64 *)&local_40);
                  local_48 = local_48 + iVar5;
                  puVar11 = (undefined1 *)-(long)local_40;
                  if (uVar2 == '\0') {
                    puVar11 = local_40;
                  }
                  puVar15 = puVar15 + (long)puVar11;
                }
                else {
                  local_48 = (byte *)0x0;
                }
              }
              else {
                bVar8 = *local_50;
                if (*local_50 != 0) {
                  do {
                    pbVar1 = local_50 + 1;
                    local_50 = local_50 + 1;
                    bVar9 = bVar8 & 0x80;
                    bVar8 = *pbVar1;
                  } while (bVar9 != 0 || *pbVar1 != 0);
                }
                local_50 = local_50 + 1;
                if (local_50 < pBuf + iVar13) {
                  local_40 = &DAT_aaaaaaaaaaaaaaaa;
                  iVar5 = sqlite3Fts3GetVarintU((char *)local_50,(sqlite_uint64 *)&local_40);
                  local_50 = local_50 + iVar5;
                  puVar11 = (undefined1 *)-(long)local_40;
                  if (uVar2 == '\0') {
                    puVar11 = local_40;
                  }
                  puVar14 = puVar14 + (long)puVar11;
                }
                else {
                  local_50 = (byte *)0x0;
                }
              }
            } while ((local_48 != (byte *)0x0) && (local_50 != (byte *)0x0));
          }
          iVar13 = (int)local_58 - (int)pbVar6;
          iVar5 = 0;
          if (uVar2 != '\0') {
            sqlite3_free(pBuf);
            pBuf = pbVar6;
          }
        }
        else {
          iVar5 = sqlite3_initialize();
          if (iVar5 == 0) {
            pbVar6 = (byte *)sqlite3Malloc((long)iVar13 + 10);
          }
          else {
            pbVar6 = (byte *)0x0;
          }
          if (pbVar6 != (byte *)0x0) goto LAB_001cce7a;
          iVar5 = 7;
        }
        sqlite3_free(pList);
        (p->doclist).aAll = (char *)pBuf;
        (p->doclist).nAll = iVar13;
        goto LAB_001cd21e;
      }
      sqlite3_free(pList);
    }
  }
  iVar5 = 0;
LAB_001cd21e:
  if (p->iDoclistToken < iToken) {
    p->iDoclistToken = iToken;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

static int fts3EvalPhraseMergeToken(
  Fts3Table *pTab,                /* FTS Table pointer */
  Fts3Phrase *p,                  /* Phrase to merge pList/nList into */
  int iToken,                     /* Token pList/nList corresponds to */
  char *pList,                    /* Pointer to doclist */
  int nList                       /* Number of bytes in pList */
){
  int rc = SQLITE_OK;
  assert( iToken!=p->iDoclistToken );

  if( pList==0 ){
    sqlite3_free(p->doclist.aAll);
    p->doclist.aAll = 0;
    p->doclist.nAll = 0;
  }

  else if( p->iDoclistToken<0 ){
    p->doclist.aAll = pList;
    p->doclist.nAll = nList;
  }

  else if( p->doclist.aAll==0 ){
    sqlite3_free(pList);
  }

  else {
    char *pLeft;
    char *pRight;
    int nLeft;
    int nRight;
    int nDiff;

    if( p->iDoclistToken<iToken ){
      pLeft = p->doclist.aAll;
      nLeft = p->doclist.nAll;
      pRight = pList;
      nRight = nList;
      nDiff = iToken - p->iDoclistToken;
    }else{
      pRight = p->doclist.aAll;
      nRight = p->doclist.nAll;
      pLeft = pList;
      nLeft = nList;
      nDiff = p->iDoclistToken - iToken;
    }

    rc = fts3DoclistPhraseMerge(
        pTab->bDescIdx, nDiff, pLeft, nLeft, &pRight, &nRight
    );
    sqlite3_free(pLeft);
    p->doclist.aAll = pRight;
    p->doclist.nAll = nRight;
  }

  if( iToken>p->iDoclistToken ) p->iDoclistToken = iToken;
  return rc;
}